

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O1

int has_ext(char *ext)

{
  byte *__haystack;
  byte *pbVar1;
  size_t sVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)exts;
  if ((ext != (char *)0x0 && exts != (char *)0x0) &&
     (pbVar1 = (byte *)strstr(exts,ext), pbVar1 != (byte *)0x0)) {
    sVar2 = strlen(ext);
    do {
      __haystack = pbVar1 + sVar2;
      if (((pbVar1 == pbVar3) || (pbVar1[-1] == 0x20)) && ((*__haystack & 0xdf) == 0)) {
        return 1;
      }
      pbVar1 = (byte *)strstr((char *)__haystack,ext);
      pbVar3 = __haystack;
    } while (pbVar1 != (byte *)0x0);
  }
  return 0;
}

Assistant:

static int has_ext(const char *ext) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(max_loaded_major < 3) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        int index;

        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];

            if(strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}